

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void synthetic_create(stagewise_poly *poly,example *ec,bool training)

{
  vw *all;
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  undefined7 in_register_00000011;
  uint32_t *puVar4;
  uint64_t *puVar5;
  bool bVar6;
  
  synthetic_reset(poly,ec);
  poly->cur_depth = 0;
  (poly->synth_rec_f).x = 1.0;
  all = poly->all;
  bVar6 = (all->weights).sparse != false;
  puVar4 = &(all->weights).dense_weights._stride_shift;
  if (bVar6) {
    puVar4 = &(all->weights).sparse_weights._stride_shift;
  }
  puVar5 = &(all->weights).dense_weights._weight_mask;
  if (bVar6) {
    puVar5 = &(all->weights).sparse_weights._weight_mask;
  }
  (poly->synth_rec_f).weight_index = (ulong)all->wpp * 0xb1c55c << ((byte)*puVar4 & 0x3f) & *puVar5;
  poly->training = training;
  GD::foreach_feature<stagewise_poly,_unsigned_long,_&synthetic_create_rec>
            (all,poly->original_ec,poly);
  synthetic_decycle(poly);
  (poly->synth_ec).total_sum_feat_sq =
       (poly->synth_ec).super_example_predict.feature_space[0x86].sum_feat_sq;
  if ((int)CONCAT71(in_register_00000011,training) != 0) {
    poly->sum_sparsity = poly->sum_sparsity + (poly->synth_ec).num_features;
    lVar2 = ec->num_features + poly->sum_input_sparsity;
    lVar3 = poly->num_examples + 1;
    auVar1._8_4_ = (int)lVar3;
    auVar1._0_8_ = lVar2;
    auVar1._12_4_ = (int)((ulong)lVar3 >> 0x20);
    poly->sum_input_sparsity = lVar2;
    poly->num_examples = auVar1._8_8_;
  }
  return;
}

Assistant:

void synthetic_create(stagewise_poly &poly, example &ec, bool training)
{
  synthetic_reset(poly, ec);

  poly.cur_depth = 0;

  poly.synth_rec_f.x = 1.0;
  poly.synth_rec_f.weight_index = constant_feat_masked(poly);  // note: not ft_offset'd
  poly.training = training;
  /*
   * Another choice is to mark the constant feature as the single initial
   * parent, and recurse just on that feature (which arguably correctly interprets poly.cur_depth).
   * Problem with this is if there is a collision with the root...
   */
  GD::foreach_feature<stagewise_poly, uint64_t, synthetic_create_rec>(*poly.all, *poly.original_ec, poly);
  synthetic_decycle(poly);
  poly.synth_ec.total_sum_feat_sq = poly.synth_ec.feature_space[tree_atomics].sum_feat_sq;

  if (training)
  {
    poly.sum_sparsity += poly.synth_ec.num_features;
    poly.sum_input_sparsity += ec.num_features;
    poly.num_examples += 1;
  }
}